

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

TestNode *
deqp::gls::Functional::ScissorTestInternal::createClearTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,Vec4 *scissorArea,
          deUint32 clearMode)

{
  pointer pcVar1;
  TestNode *this;
  
  this = (TestNode *)operator_new(0x90);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,desc);
  ((TestNode *)&this->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0079b2c0;
  ((TestNode *)&this[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)renderCtx;
  pcVar1 = *(pointer *)(scissorArea->m_data + 2);
  this[1].m_testCtx = *(TestContext **)scissorArea->m_data;
  this[1].m_name._M_dataplus._M_p = pcVar1;
  ((TestNode *)&this->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0079b320;
  *(deUint32 *)&this[1].m_name._M_string_length = clearMode;
  return this;
}

Assistant:

tcu::TestNode* createClearTest (tcu::TestContext&	testCtx,
								glu::RenderContext&	renderCtx,
								const char*			name,
								const char*			desc,
								const Vec4&			scissorArea,
								deUint32			clearMode)
{
	return new ScissorClearCase(testCtx, renderCtx, name, desc, scissorArea, clearMode);
}